

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O1

int write_to_file(char *path,char *data)

{
  FILE *__stream;
  
  __stream = fopen(path,"wb");
  if (__stream != (FILE *)0x0) {
    fputs(data,__stream);
    fclose(__stream);
  }
  return (uint)(__stream == (FILE *)0x0);
}

Assistant:

static int
write_to_file(const char *path, const char *data)
{
	FILE *file = fopen(path, "wb");
	if (!file)
		return 1;
	fputs(data, file);
	fclose(file);
	return 0;
}